

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Stream::printError(Stream *this,Node *N,Twine *Msg)

{
  SMLoc Message;
  pointer this_00;
  ArrayRef<llvm::SMRange> local_48;
  SMLoc local_38;
  undefined1 local_30 [8];
  SMRange Range;
  Twine *Msg_local;
  Node *N_local;
  Stream *this_local;
  
  Range.End.Ptr = (char *)Msg;
  if (N == (Node *)0x0) {
    memset(local_30,0,0x10);
    SMRange::SMRange((SMRange *)local_30);
  }
  else {
    _local_30 = Node::getSourceRange(N);
  }
  this_00 = std::unique_ptr<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>::
            operator->(&this->scanner);
  Message = Range.End;
  local_38.Ptr = (char *)local_30;
  ArrayRef<llvm::SMRange>::ArrayRef(&local_48,(SMRange *)local_30);
  yaml::Scanner::printError(this_00,local_38,DK_Error,(Twine *)Message.Ptr,local_48);
  return;
}

Assistant:

void Stream::printError(Node *N, const Twine &Msg) {
  SMRange Range = N ? N->getSourceRange() : SMRange();
  scanner->printError( Range.Start
                     , SourceMgr::DK_Error
                     , Msg
                     , Range);
}